

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

void VP8LHistogramSetClear(VP8LHistogramSet *set)

{
  int cache_bits;
  int iVar1;
  VP8LHistogram **ppVVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  cache_bits = (*set->histograms)->palette_code_bits;
  iVar1 = set->max_size;
  lVar5 = (long)iVar1;
  iVar3 = (4 << ((byte)cache_bits & 0x1f)) + 0x1150;
  if (cache_bits < 1) {
    iVar3 = 0x1150;
  }
  memset(set,0,((long)iVar3 + 0x27) * lVar5 + 0x10);
  set->histograms = (VP8LHistogram **)(set + 1);
  set->max_size = iVar1;
  set->size = iVar1;
  HistogramSetResetPointers(set,cache_bits);
  if (0 < lVar5) {
    ppVVar2 = set->histograms;
    lVar4 = 0;
    do {
      ppVVar2[lVar4]->palette_code_bits = cache_bits;
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  return;
}

Assistant:

void VP8LHistogramSetClear(VP8LHistogramSet* const set) {
  int i;
  const int cache_bits = set->histograms[0]->palette_code_bits;
  const int size = set->max_size;
  const size_t total_size = HistogramSetTotalSize(size, cache_bits);
  uint8_t* memory = (uint8_t*)set;

  memset(memory, 0, total_size);
  memory += sizeof(*set);
  set->histograms = (VP8LHistogram**)memory;
  set->max_size = size;
  set->size = size;
  HistogramSetResetPointers(set, cache_bits);
  for (i = 0; i < size; ++i) {
    set->histograms[i]->palette_code_bits = cache_bits;
  }
}